

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::construct_helper<cs_impl::iostream_cs_ext::init()::$_2>::
_construct<cs_impl::iostream_cs_ext::init()::__2&,cs_impl::any,std::__cxx11::string_const&>
          (anon_class_1_0_00000001 *val,_func_any_any_ptr *target_function)

{
  cni_holder_base *pcVar1;
  _func_any_any_ptr *in_stack_ffffffffffffffd8;
  _func_any_any_ptr *in_stack_ffffffffffffffe0;
  
  check_conversion<cs_impl::any,cs_impl::any,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:560:34),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::cni_holder((cni_holder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:560:34),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)val,(anon_class_1_0_00000001 *)target_function);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}